

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O1

mcu8str * mcu8str_copy(mcu8str *__return_storage_ptr__,mcu8str *str)

{
  if ((ulong)str->size == 0) {
    __return_storage_ptr__->c_str = mcu8str_create_empty::dummy;
    __return_storage_ptr__->size = 0;
    __return_storage_ptr__->buflen = 0;
    __return_storage_ptr__->owns_memory = 0;
  }
  else {
    mcu8str_create(__return_storage_ptr__,(ulong)str->size);
    mcu8str_assign(__return_storage_ptr__,str);
  }
  return __return_storage_ptr__;
}

Assistant:

mcu8str mcu8str_copy( const mcu8str* str )
  {
    if ( str->size == 0 )
      return mcu8str_create_empty();
    mcu8str newstr = mcu8str_create( str->size );
    mcu8str_assign( &newstr, str );
    return newstr;
  }